

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder.c
# Opt level: O2

lzma_ret lzma_lzma_encoder_create
                   (lzma_coder_conflict9 **coder_ptr,lzma_allocator *allocator,
                   lzma_options_lzma *options,lzma_lz_options_conflict *lz_options)

{
  byte bVar1;
  lzma_ret lVar2;
  lzma_coder_conflict9 *coder;
  byte bVar3;
  uint32_t uVar4;
  _Bool _Var5;
  
  coder = *coder_ptr;
  if (coder == (lzma_coder_conflict9 *)0x0) {
    coder = (lzma_coder_conflict9 *)lzma_alloc(0x3cee8,allocator);
    *coder_ptr = coder;
    if (coder == (lzma_coder_conflict9 *)0x0) {
      return LZMA_MEM_ERROR;
    }
  }
  if (options->mode == LZMA_MODE_NORMAL) {
    coder->fast_mode = false;
    bVar3 = 0;
    uVar4 = 0xfffffffe;
    do {
      bVar1 = bVar3 & 0x1f;
      bVar3 = bVar3 + 1;
      uVar4 = uVar4 + 2;
    } while ((uint)(1 << bVar1) < options->dict_size);
    coder->dist_table_size = uVar4;
    uVar4 = options->nice_len - 1;
    (coder->match_len_encoder).table_size = uVar4;
    (coder->rep_len_encoder).table_size = uVar4;
  }
  else {
    if (options->mode != LZMA_MODE_FAST) {
      return LZMA_OPTIONS_ERROR;
    }
    coder->fast_mode = true;
  }
  if (options->preset_dict == (uint8_t *)0x0) {
    _Var5 = false;
  }
  else {
    _Var5 = options->preset_dict_size != 0;
  }
  coder->is_initialized = _Var5;
  coder->is_flushed = false;
  set_lz_options(lz_options,options);
  lVar2 = lzma_lzma_encoder_reset(coder,options);
  return lVar2;
}

Assistant:

extern lzma_ret
lzma_lzma_encoder_create(lzma_coder **coder_ptr, lzma_allocator *allocator,
		const lzma_options_lzma *options, lzma_lz_options *lz_options)
{
	lzma_coder *coder;
	uint32_t log_size = 0;

	// Allocate lzma_coder if it wasn't already allocated.
	if (*coder_ptr == NULL) {
		*coder_ptr = lzma_alloc(sizeof(lzma_coder), allocator);
		if (*coder_ptr == NULL)
			return LZMA_MEM_ERROR;
	}

	coder = *coder_ptr;

	// Set compression mode. We haven't validates the options yet,
	// but it's OK here, since nothing bad happens with invalid
	// options in the code below, and they will get rejected by
	// lzma_lzma_encoder_reset() call at the end of this function.
	switch (options->mode) {
		case LZMA_MODE_FAST:
			coder->fast_mode = true;
			break;

		case LZMA_MODE_NORMAL: {
			coder->fast_mode = false;

			// Set dist_table_size.
			// Round the dictionary size up to next 2^n.
			while ((UINT32_C(1) << log_size) < options->dict_size)
				++log_size;

			coder->dist_table_size = log_size * 2;

			// Length encoders' price table size
			coder->match_len_encoder.table_size
				= options->nice_len + 1 - MATCH_LEN_MIN;
			coder->rep_len_encoder.table_size
				= options->nice_len + 1 - MATCH_LEN_MIN;
			break;
		}

		default:
			return LZMA_OPTIONS_ERROR;
	}

	// We don't need to write the first byte as literal if there is
	// a non-empty preset dictionary. encode_init() wouldn't even work
	// if there is a non-empty preset dictionary, because encode_init()
	// assumes that position is zero and previous byte is also zero.
	coder->is_initialized = options->preset_dict != NULL
			&& options->preset_dict_size > 0;
	coder->is_flushed = false;

	set_lz_options(lz_options, options);

	return lzma_lzma_encoder_reset(coder, options);
}